

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O3

bool __thiscall
soplex::SPxFastRT<double>::maxShortLeave
          (SPxFastRT<double> *this,double *sel,int leave,double maxabs)

{
  double dVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  SPxSolverBase<double> *pSVar3;
  UpdateVector<double> *pUVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  
  peVar2 = (this->super_SPxRatioTester<double>)._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->super_SPxRatioTester<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    dVar9 = peVar2->s_epsilon_multiplier;
    uVar8 = -(ulong)(dVar9 == 1.0);
    dVar9 = (double)(~uVar8 & (ulong)(dVar9 * 1e-05) | uVar8 & 0x3ee4f8b588e368f1);
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    dVar9 = peVar2->s_epsilon_multiplier;
    uVar8 = -(ulong)(dVar9 == 1.0);
    dVar9 = (double)(~uVar8 & (ulong)(dVar9 * 1e-05) | uVar8 & 0x3ee4f8b588e368f1);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pSVar3 = (this->super_SPxRatioTester<double>).thesolver;
  pUVar4 = pSVar3->theFvec;
  lVar6 = (long)leave;
  dVar1 = (pUVar4->thedelta).super_VectorBase<double>.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar6];
  *sel = dVar1;
  lVar7 = 0x670;
  if ((dVar9 * maxabs < dVar1) || (lVar7 = 0x688, dVar1 < dVar9 * -maxabs)) {
    *sel = (*(double *)
             (*(long *)((long)&(pSVar3->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                               super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                               _vptr_ClassArray + lVar7) + lVar6 * 8) -
           (pUVar4->super_VectorBase<double>).val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar6]) / dVar1;
    bVar5 = true;
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool SPxFastRT<R>::maxShortLeave(R& sel, int leave, R maxabs)
{
   assert(leave >= 0);
   assert(maxabs >= 0);

   R shortval = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_SHORTVAL);

   sel = this->thesolver->fVec().delta()[leave];

   if(sel > maxabs * shortval)
   {
      sel = (this->thesolver->ubBound()[leave] - this->thesolver->fVec()[leave]) / sel;
      return true;
   }

   if(sel < -maxabs * shortval)
   {
      sel = (this->thesolver->lbBound()[leave] - this->thesolver->fVec()[leave]) / sel;
      return true;
   }

   return false;
}